

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm_test.cpp
# Opt level: O0

pint p_test_case_pshm_nomem_test(void)

{
  int iVar1;
  pint pVar2;
  long lVar3;
  code *local_20;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  vtable.f_realloc = pmem_free;
  local_20 = pmem_alloc;
  vtable.f_malloc = pmem_realloc;
  iVar1 = p_mem_set_vtable(&local_20);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x5e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_shm_new("p_shm_test_memory_block",0x400,1);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x60);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_mem_restore_vtable();
  p_libsys_shutdown();
  pVar2 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar2 = 0;
  }
  return pVar2;
}

Assistant:

P_TEST_CASE_BEGIN (pshm_nomem_test)
{
	p_libsys_init ();

	PMemVTable vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

	P_TEST_CHECK (p_shm_new ("p_shm_test_memory_block", 1024, P_SHM_ACCESS_READWRITE, NULL) == NULL);

	p_mem_restore_vtable ();

	p_libsys_shutdown ();
}